

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O0

ErrorType __thiscall
Network::Client::MQTTv5::connectTo
          (MQTTv5 *this,char *serverHost,uint16 port,bool useTLS,uint16 keepAliveTimeInSec,
          bool cleanStart,char *userName,DynamicBinDataView *password,WillMessage *willMessage,
          QoSDelivery willQoS,bool willRetain,Properties *properties)

{
  byte bVar1;
  bool bVar2;
  uint8 uVar3;
  int iVar4;
  Type TVar5;
  ControlPacketType CVar6;
  ControlPacketType type;
  int ret;
  ControlPacket<(Protocol::MQTT::Common::ControlPacketType)1,_false> packet;
  undefined1 local_98 [8];
  Property<unsigned_short> maxRecv;
  Property<unsigned_int> maxProp;
  bool willRetain_local;
  bool cleanStart_local;
  uint16 keepAliveTimeInSec_local;
  bool useTLS_local;
  uint16 port_local;
  char *serverHost_local;
  MQTTv5 *this_local;
  ErrorType ret_1;
  
  if ((serverHost == (char *)0x0) || (port == 0)) {
    ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),BadParameter);
  }
  else {
    Protocol::MQTT::V5::Property<unsigned_int>::Property
              ((Property<unsigned_int> *)&maxRecv.value.value,PacketSizeMax,
               (this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers.size,false);
    bVar1 = Buffers::packetsCount
                      (&(this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers);
    Protocol::MQTT::V5::Property<unsigned_short>::Property
              ((Property<unsigned_short> *)local_98,ReceiveMax,(ushort)bVar1,false);
    Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)1,_false>::
    ControlPacket((ControlPacket<(Protocol::MQTT::Common::ControlPacketType)1,_false> *)&ret);
    bVar2 = ImplBase<Network::Client::MQTTv5::Impl>::isOpen
                      (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>);
    if (bVar2) {
      ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),AlreadyConnected);
    }
    else {
      Protocol::MQTT::V5::Properties::capture
                ((Properties *)&packet.fixedVariableHeader._v.value,properties);
      if ((this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers.size < 0xfffffff) {
        Protocol::MQTT::V5::Properties::append
                  ((Properties *)&packet.fixedVariableHeader._v.value,
                   (PropertyBase *)&maxRecv.value.value);
      }
      uVar3 = Buffers::packetsCount
                        (&(this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers);
      if (uVar3 != '\0') {
        Protocol::MQTT::V5::Properties::append
                  ((Properties *)&packet.fixedVariableHeader._v.value,(PropertyBase *)local_98);
      }
      iVar4 = Impl::connectWith(this->impl,serverHost,port,useTLS);
      if (iVar4 == 0) {
        (this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>).keepAlive =
             (uint16)((uint)keepAliveTimeInSec + (uint)(keepAliveTimeInSec >> 1) >> 1);
        packet.fixedVariableHeader.super_ConnectHeaderImpl.protocolName._0_2_ = keepAliveTimeInSec;
        Protocol::MQTT::Common::BitField<unsigned_char,_1,_1>::operator=
                  ((BitField<unsigned_char,_1,_1> *)
                   ((long)&packet.fixedVariableHeader.super_FixedFieldGeneric.value + 7),cleanStart)
        ;
        Protocol::MQTT::Common::BitField<unsigned_char,_2,_1>::operator=
                  ((BitField<unsigned_char,_2,_1> *)
                   ((long)&packet.fixedVariableHeader.super_FixedFieldGeneric.value + 7),
                   willMessage != (WillMessage *)0x0);
        Protocol::MQTT::Common::BitField<unsigned_char,_3,_2>::operator=
                  ((BitField<unsigned_char,_3,_2> *)
                   ((long)&packet.fixedVariableHeader.super_FixedFieldGeneric.value + 7),
                   (undefined1)willQoS);
        Protocol::MQTT::Common::BitField<unsigned_char,_5,_1>::operator=
                  ((BitField<unsigned_char,_5,_1> *)
                   ((long)&packet.fixedVariableHeader.super_FixedFieldGeneric.value + 7),willRetain)
        ;
        Protocol::MQTT::Common::BitField<unsigned_char,_6,_1>::operator=
                  ((BitField<unsigned_char,_6,_1> *)
                   ((long)&packet.fixedVariableHeader.super_FixedFieldGeneric.value + 7),
                   password != (DynamicBinDataView *)0x0);
        Protocol::MQTT::Common::BitField<unsigned_char,_7,_1>::operator=
                  ((BitField<unsigned_char,_7,_1> *)
                   ((long)&packet.fixedVariableHeader.super_FixedFieldGeneric.value + 7),
                   userName != (char *)0x0);
        Protocol::MQTT::Common::DynamicStringView::operator=
                  ((DynamicStringView *)&packet.payload,
                   &(this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>).clientID);
        if (willMessage != (WillMessage *)0x0) {
          packet.payload._32_8_ = willMessage;
        }
        if (userName != (char *)0x0) {
          Protocol::MQTT::Common::DynamicStringView::operator=
                    ((DynamicStringView *)&packet.payload.willMessage,userName);
        }
        if (password != (DynamicBinDataView *)0x0) {
          Protocol::MQTT::Common::DynamicBinDataView::operator=
                    ((DynamicBinDataView *)&packet.payload.username.data,password);
        }
        this_local._4_4_ =
             (int32)ImplBase<Network::Client::MQTTv5::Impl>::prepareSAR
                              (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,
                               (ControlPacketSerializable *)&ret,true,false);
        TVar5 = ErrorType::operator_cast_to_Type((ErrorType *)((long)&this_local + 4));
        if (TVar5 == Success) {
          CVar6 = ImplBase<Network::Client::MQTTv5::Impl>::getLastPacketType
                            (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>);
          if (CVar6 == CONNACK) {
            this_local._4_4_ =
                 ImplBase<Network::Client::MQTTv5::Impl>::handleConnACK
                           (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>);
            TVar5 = ErrorType::operator_cast_to_Type((ErrorType *)((long)&this_local + 4));
            if (TVar5 != Success) {
              ImplBase<Network::Client::MQTTv5::Impl>::close
                        (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
            }
          }
          else {
            ImplBase<Network::Client::MQTTv5::Impl>::close
                      (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
            ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),ProtocolError);
          }
        }
        else {
          ImplBase<Network::Client::MQTTv5::Impl>::close
                    (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
        }
      }
      else {
        ImplBase<Network::Client::MQTTv5::Impl>::close
                  (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
        ErrorType::ErrorType
                  ((ErrorType *)((long)&this_local + 4),(uint)(iVar4 == -7) << 2 | NetworkError);
      }
    }
    Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)1,_false>::
    ~ControlPacket((ControlPacket<(Protocol::MQTT::Common::ControlPacketType)1,_false> *)&ret);
    Protocol::MQTT::V5::Property<unsigned_short>::~Property((Property<unsigned_short> *)local_98);
    Protocol::MQTT::V5::Property<unsigned_int>::~Property
              ((Property<unsigned_int> *)&maxRecv.value.value);
  }
  return (ErrorType)this_local._4_4_;
}

Assistant:

MQTTv5::ErrorType MQTTv5::connectTo(const char * serverHost, const uint16 port, bool useTLS, const uint16 keepAliveTimeInSec,
        const bool cleanStart, const char * userName, const DynamicBinDataView * password, WillMessage * willMessage, const QoSDelivery willQoS, const bool willRetain,
        Properties * properties)
    {
        if (serverHost == nullptr || !port)
            return ErrorType::BadParameter;

        // Please do not move the line below as it must outlive the packet
        Protocol::MQTT::V5::Property<uint32> maxProp(Protocol::MQTT::V5::PacketSizeMax, impl->buffers.size);
        Protocol::MQTT::V5::Property<uint16> maxRecv(Protocol::MQTT::V5::ReceiveMax, impl->buffers.packetsCount());
        Protocol::MQTT::V5::ControlPacket<Protocol::MQTT::V5::CONNECT> packet;

        if (impl->isOpen()) return ErrorType::AlreadyConnected;

        // Capture properties (to avoid copying them)
        packet.props.capture(properties);

        // Check if we have a max packet size property and if not, append one to let the server know our limitation (if any)
        if (impl->buffers.size < Protocol::MQTT::Common::VBInt::MaxPossibleSize)
            packet.props.append(&maxProp); // It'll fail silently if it already exists
        if (impl->buffers.packetsCount())
            packet.props.append(&maxRecv); // It'll fail silently if it already exists


#if MQTTAvoidValidation != 1
        if (!packet.props.checkPropertiesFor(Protocol::MQTT::V5::CONNECT))
            return ErrorType::BadProperties;
#endif

        // Check we can contact the server and connect to it (not initial write to the server is required here)
        if (int ret = impl->connectWith(serverHost, port, useTLS))
        {
            impl->close();
            return ret == -7 ? ErrorType::TimedOut : ErrorType::NetworkError;
        }

        // Create the header object now
        impl->keepAlive = (keepAliveTimeInSec + (keepAliveTimeInSec / 2)) / 2; // Make it 75% of what's given so we always wake up before doom's clock
        packet.fixedVariableHeader.keepAlive = keepAliveTimeInSec;
        packet.fixedVariableHeader.cleanStart = cleanStart ? 1 : 0;
        packet.fixedVariableHeader.willFlag = willMessage != nullptr ? 1 : 0;
        packet.fixedVariableHeader.willQoS = (uint8)willQoS;
        packet.fixedVariableHeader.willRetain = willRetain ? 1 : 0;
        packet.fixedVariableHeader.passwordFlag = password != nullptr ? 1 : 0;
        packet.fixedVariableHeader.usernameFlag = userName != nullptr ? 1 : 0;

        // And the payload too now
        packet.payload.clientID = impl->clientID;
        if (willMessage != nullptr) packet.payload.willMessage = willMessage;
        if (userName != nullptr)    packet.payload.username = userName;
        if (password != nullptr)    packet.payload.password = *password;

        // Ok, setting are done, let's build this packet now
        if (ErrorType ret = impl->prepareSAR(packet))
        {
            impl->close();
            return ret;
        }

        // Then extract the packet type
        Protocol::MQTT::V5::ControlPacketType type = impl->getLastPacketType();
        if (type == Protocol::MQTT::V5::CONNACK)
        {
            ErrorType ret = impl->handleConnACK();

            if (ret != ErrorType::Success)
                impl->close();
            return ret;
        }
#if MQTTUseAuth == 1
        else if (type == Protocol::MQTT::V5::AUTH)
        {
            // Authentication need to know if we are in a CONNECT/CONNACK process since it behaves differently in that case
            impl->setConnectionState(State::Authenticating);

            if (impl->handleAuth() == ErrorType::Success)
            { // We need to receive either a CONNACK or a AUTH packet now, so let's do that until we're done
                while (true)
                {
                    // Ok, now we have a packet read it
                    type = impl->getLastPacketType();
                    if (type == Protocol::MQTT::V5::CONNACK)
                    {
                        ErrorType ret = impl->handleConnACK();
                        if (ret != ErrorType::Success)
                            impl->close();

                        return ret;
                    }
                    else if (type == Protocol::MQTT::V5::AUTH)
                    {
                        if (ErrorType ret = impl->handleAuth())
                        {   // In case of authentication error, let's report back up
                            impl->close();
                            return ret;
                        }   // Else, let's continue the Authentication dance
                    }
                    else
                    {
                        impl->close();
                        return Protocol::MQTT::V5::ProtocolError;
                    }
                }
            }
        }
#endif
        // All other cases are error, let's close the connection now.
        impl->close();
        return Protocol::MQTT::V5::ProtocolError;
    }